

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

QTextLayoutStruct * __thiscall
QTextDocumentLayoutPrivate::layoutCell
          (QTextLayoutStruct *__return_storage_ptr__,QTextDocumentLayoutPrivate *this,QTextTable *t,
          QTextTableCell *cell,QFixed width,int layoutFrom,int layoutTo,QTextTableData *td,
          QFixed absoluteTableY,bool withPageBreaks)

{
  qreal qVar1;
  Iterator it;
  QFixed QVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Position PVar7;
  QTextFrameData *pQVar8;
  int i;
  ulong uVar9;
  long in_FS_OFFSET;
  QSizeF QVar10;
  iterator local_88;
  QTextFormat local_68;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lcTable();
  if (((byte)lcTable::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1) != 0) {
    local_58._0_4_ = 2;
    local_58._4_4_ = 0;
    local_58._8_4_ = 0;
    local_58._12_4_ = 0;
    local_58._16_4_ = 0;
    local_58._20_4_ = 0;
    local_58._24_8_ = lcTable::category.name;
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)&local_68,"layoutCell");
    QDebug::~QDebug((QDebug *)&local_68);
  }
  *(undefined1 **)&__return_storage_ptr__->maximumWidth = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->frame = (QTextFrame *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&__return_storage_ptr__->x_left = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->frameY = 0;
  __return_storage_ptr__->y = 0;
  __return_storage_ptr__->contentsWidth = 0;
  __return_storage_ptr__->minimumWidth = 0;
  __return_storage_ptr__->fullLayout = false;
  (__return_storage_ptr__->pendingFloats).d.d = (Data *)0x0;
  (__return_storage_ptr__->pendingFloats).d.ptr = (QTextFrame **)0x0;
  (__return_storage_ptr__->pendingFloats).d.size = 0;
  __return_storage_ptr__->pageHeight = 0;
  __return_storage_ptr__->pageBottom = 0;
  __return_storage_ptr__->pageTopMargin = 0;
  __return_storage_ptr__->pageBottomMargin = 0;
  (__return_storage_ptr__->updateRect).xp = 0.0;
  (__return_storage_ptr__->updateRect).yp = 0.0;
  (__return_storage_ptr__->updateRect).w = 0.0;
  (__return_storage_ptr__->updateRectForFloats).h = 0.0;
  (__return_storage_ptr__->updateRect).h = 0.0;
  (__return_storage_ptr__->updateRectForFloats).xp = 0.0;
  (__return_storage_ptr__->updateRectForFloats).yp = 0.0;
  (__return_storage_ptr__->updateRectForFloats).w = 0.0;
  __return_storage_ptr__->frame = &t->super_QTextFrame;
  (__return_storage_ptr__->maximumWidth).val = 0x1fffffc0;
  QVar2 = QTextTableData::topPadding(td,t,cell);
  if (withPageBreaks) {
    iVar3 = QTextTableCell::row(cell);
    (__return_storage_ptr__->frameY).val =
         QVar2.val + absoluteTableY.val + (td->rowPositions).d.ptr[iVar3].val;
  }
  (__return_storage_ptr__->x_left).val = 0;
  (__return_storage_ptr__->x_right).val = width.val;
  QVar10 = QTextDocument::pageSize((this->super_QAbstractTextDocumentLayoutPrivate).document);
  iVar4 = (int)(QVar10.ht * 64.0);
  iVar3 = 0x1fffffc0;
  if (withPageBreaks) {
    iVar3 = iVar4;
  }
  if (iVar4 < 0) {
    iVar3 = 0x1fffffc0;
  }
  (__return_storage_ptr__->pageHeight).val = iVar3;
  iVar5 = QTextLayoutStruct::currentPage(__return_storage_ptr__);
  iVar3 = (td->super_QTextFrameData).effectiveTopMargin.val;
  iVar4 = (td->cellSpacing).val;
  iVar6 = (td->super_QTextFrameData).border.val;
  QTextTableCell::format((QTextTableCell *)local_58);
  QVar2 = QTextTableData::paddingProperty(td,(QTextFormat *)local_58,TableCellTopPadding);
  (__return_storage_ptr__->pageTopMargin).val = QVar2.val + iVar3 + iVar4 + iVar6;
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  QTextTable::format((QTextTable *)local_58);
  iVar3 = QTextTableFormat::headerRowCount((QTextTableFormat *)local_58);
  QTextFormat::~QTextFormat((QTextFormat *)local_58);
  if ((0 < iVar3) && (td->borderCollapse != false)) {
    QTextTableCell::column(cell);
    QTextTable::cellAt((QTextTable *)&local_68,(int)t,iVar3 + -1);
    axisEdgeData((EdgeData *)local_58,t,td,(QTextTableCell *)&local_68,BottomEdge);
    qVar1 = scaleToDevice(this,(qreal)CONCAT44(local_58._4_4_,local_58._0_4_));
    (__return_storage_ptr__->pageTopMargin).val =
         (__return_storage_ptr__->pageTopMargin).val + (int)(qVar1 * 0.5 * 64.0);
  }
  iVar3 = (td->super_QTextFrameData).effectiveBottomMargin.val;
  iVar4 = (td->cellSpacing).val;
  iVar6 = (td->effectiveBottomBorder).val;
  QVar2 = QTextTableData::bottomPadding(td,t,cell);
  iVar6 = QVar2.val + iVar3 + iVar4 + iVar6;
  (__return_storage_ptr__->pageBottomMargin).val = iVar6;
  iVar3 = (__return_storage_ptr__->y).val;
  iVar4 = (__return_storage_ptr__->pageHeight).val;
  (__return_storage_ptr__->pageBottom).val = (iVar5 + 1) * iVar4 - iVar6;
  __return_storage_ptr__->fullLayout = true;
  iVar4 = (iVar4 * iVar5 + (__return_storage_ptr__->pageTopMargin).val) -
          (__return_storage_ptr__->frameY).val;
  if (iVar4 < iVar3) {
    iVar4 = iVar3;
  }
  (__return_storage_ptr__->y).val = iVar4;
  local_58._16_4_ = -0x55555556;
  local_58._20_4_ = 0xaaaaaaaa;
  local_58._0_4_ = 0xaaaaaaaa;
  local_58._4_4_ = 0xaaaaaaaa;
  local_58._8_4_ = -0x55555556;
  local_58._12_4_ = 0xaaaaaaaa;
  iVar3 = QTextTableCell::row(cell);
  iVar4 = QTextTableCell::column(cell);
  iVar6 = QTextTable::rows(t);
  local_68.d.d.ptr._0_4_ = iVar6 * iVar4 + iVar3;
  QMultiHash<int,_QTextFrame_*>::valuesImpl<int>
            ((QList<QTextFrame_*> *)local_58,&td->childFrameMap,(int *)&local_68);
  for (uVar9 = 0; uVar9 < CONCAT44(local_58._20_4_,local_58._16_4_); uVar9 = uVar9 + 1) {
    pQVar8 = ::data(*(QTextFrame **)(CONCAT44(local_58._12_4_,local_58._8_4_) + uVar9 * 8));
    pQVar8->sizeDirty = true;
  }
  QTextTableCell::begin(&local_88,cell);
  it.b = local_88.b;
  it.e = local_88.e;
  it.f = local_88.f;
  it.cf = local_88.cf;
  it.cb = local_88.cb;
  it._28_4_ = local_88._28_4_;
  layoutFlow(this,it,__return_storage_ptr__,layoutFrom,layoutTo,width);
  iVar3 = 0;
  for (uVar9 = 0; uVar9 < CONCAT44(local_58._20_4_,local_58._16_4_); uVar9 = uVar9 + 1) {
    pQVar8 = ::data(*(QTextFrame **)(CONCAT44(local_58._12_4_,local_58._8_4_) + uVar9 * 8));
    QTextFrame::frameFormat((QTextFrame *)&local_68);
    PVar7 = QTextFrameFormat::position((QTextFrameFormat *)&local_68);
    QTextFormat::~QTextFormat(&local_68);
    if (PVar7 != InFlow) {
      iVar6 = (pQVar8->position).y.val + (pQVar8->size).height.val;
      iVar4 = (__return_storage_ptr__->y).val;
      if (iVar6 < iVar4) {
        iVar6 = iVar4;
      }
      (__return_storage_ptr__->y).val = iVar6;
    }
    iVar4 = (pQVar8->minimumWidth).val;
    if (iVar3 <= iVar4) {
      iVar3 = iVar4;
    }
  }
  iVar4 = (__return_storage_ptr__->minimumWidth).val;
  iVar6 = (__return_storage_ptr__->maximumWidth).val;
  if (iVar6 <= iVar3) {
    iVar6 = iVar3;
  }
  (__return_storage_ptr__->maximumWidth).val = iVar6;
  if (iVar3 < iVar4) {
    iVar3 = iVar4;
  }
  (__return_storage_ptr__->minimumWidth).val = iVar3;
  pQVar8 = ::data(&t->super_QTextFrame);
  QList<QPointer<QTextFrame>_>::clear(&pQVar8->floats);
  QArrayDataPointer<QTextFrame_*>::~QArrayDataPointer((QArrayDataPointer<QTextFrame_*> *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QTextLayoutStruct QTextDocumentLayoutPrivate::layoutCell(QTextTable *t, const QTextTableCell &cell, QFixed width,
                                                        int layoutFrom, int layoutTo, QTextTableData *td,
                                                        QFixed absoluteTableY, bool withPageBreaks)
{
    qCDebug(lcTable) << "layoutCell";
    QTextLayoutStruct layoutStruct;
    layoutStruct.frame = t;
    layoutStruct.minimumWidth = 0;
    layoutStruct.maximumWidth = QFIXED_MAX;
    layoutStruct.y = 0;

    const QFixed topPadding = td->topPadding(t, cell);
    if (withPageBreaks) {
        layoutStruct.frameY = absoluteTableY + td->rowPositions.at(cell.row()) + topPadding;
    }
    layoutStruct.x_left = 0;
    layoutStruct.x_right = width;
    // we get called with different widths all the time (for example for figuring
    // out the min/max widths), so we always have to do the full layout ;(
    // also when for example in a table layoutFrom/layoutTo affect only one cell,
    // making that one cell grow the available width of the other cells may change
    // (shrink) and therefore when layoutCell gets called for them they have to
    // be re-laid out, even if layoutFrom/layoutTo is not in their range. Hence
    // this line:

    layoutStruct.pageHeight = QFixed::fromReal(document->pageSize().height());
    if (layoutStruct.pageHeight < 0 || !withPageBreaks)
        layoutStruct.pageHeight = QFIXED_MAX;
    const int currentPage = layoutStruct.currentPage();

    layoutStruct.pageTopMargin = td->effectiveTopMargin
            + td->cellSpacing
            + td->border
            + td->paddingProperty(cell.format(), QTextFormat::TableCellTopPadding); // top cell-border is not repeated

#ifndef QT_NO_CSSPARSER
    const int headerRowCount = t->format().headerRowCount();
    if (td->borderCollapse && headerRowCount > 0) {
        // consider the header row's bottom edge width
        qreal headerRowBottomBorderWidth = axisEdgeData(t, td, t->cellAt(headerRowCount - 1, cell.column()), QCss::BottomEdge).width;
        layoutStruct.pageTopMargin += QFixed::fromReal(scaleToDevice(headerRowBottomBorderWidth) / 2);
    }
#endif

    layoutStruct.pageBottomMargin = td->effectiveBottomMargin + td->cellSpacing + td->effectiveBottomBorder + td->bottomPadding(t, cell);
    layoutStruct.pageBottom = (currentPage + 1) * layoutStruct.pageHeight - layoutStruct.pageBottomMargin;

    layoutStruct.fullLayout = true;

    QFixed pageTop = currentPage * layoutStruct.pageHeight + layoutStruct.pageTopMargin - layoutStruct.frameY;
    layoutStruct.y = qMax(layoutStruct.y, pageTop);

    const QList<QTextFrame *> childFrames = td->childFrameMap.values(cell.row() + cell.column() * t->rows());
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *frame = childFrames.at(i);
        QTextFrameData *cd = data(frame);
        cd->sizeDirty = true;
    }

    layoutFlow(cell.begin(), &layoutStruct, layoutFrom, layoutTo, width);

    QFixed floatMinWidth;

    // floats that are located inside the text (like inline images) aren't taken into account by
    // layoutFlow with regards to the cell height (layoutStruct->y), so for a safety measure we
    // do that here. For example with <td><img align="right" src="..." />blah</td>
    // when the image happens to be higher than the text
    for (int i = 0; i < childFrames.size(); ++i) {
        QTextFrame *frame = childFrames.at(i);
        QTextFrameData *cd = data(frame);

        if (frame->frameFormat().position() != QTextFrameFormat::InFlow)
            layoutStruct.y = qMax(layoutStruct.y, cd->position.y + cd->size.height);

        floatMinWidth = qMax(floatMinWidth, cd->minimumWidth);
    }

    // constraint the maximum/minimumWidth by the minimum width of the fixed size floats,
    // to keep them visible
    layoutStruct.maximumWidth = qMax(layoutStruct.maximumWidth, floatMinWidth);
    layoutStruct.minimumWidth = qMax(layoutStruct.minimumWidth, floatMinWidth);

    // as floats in cells get added to the table's float list but must not affect
    // floats in other cells we must clear the list here.
    data(t)->floats.clear();

//    qDebug("layoutCell done");

    return layoutStruct;
}